

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::DescriptorPool(DescriptorPool *this,DescriptorPool *underlay)

{
  __buckets_ptr in_RSI;
  pointer in_RDI;
  Tables *in_stack_00000070;
  size_type *this_00;
  
  (in_RDI->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->known_bad_files_)._M_h._M_buckets = in_RSI;
  this_00 = &(in_RDI->known_bad_files_)._M_h._M_bucket_count;
  operator_new(0x238);
  Tables::Tables(in_stack_00000070);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,std::default_delete<google::protobuf::DescriptorPool::Tables>>
  ::unique_ptr<std::default_delete<google::protobuf::DescriptorPool::Tables>,void>
            ((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              *)this_00,in_RDI);
  *(undefined1 *)&(in_RDI->known_bad_files_)._M_h._M_before_begin._M_nxt = 1;
  *(undefined1 *)((long)&(in_RDI->known_bad_files_)._M_h._M_before_begin._M_nxt + 1) = 0;
  *(undefined1 *)((long)&(in_RDI->known_bad_files_)._M_h._M_before_begin._M_nxt + 2) = 0;
  *(undefined1 *)((long)&(in_RDI->known_bad_files_)._M_h._M_before_begin._M_nxt + 3) = 0;
  *(undefined1 *)((long)&(in_RDI->known_bad_files_)._M_h._M_before_begin._M_nxt + 4) = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x4adb6c);
  return;
}

Assistant:

DescriptorPool::DescriptorPool(const DescriptorPool* underlay)
    : mutex_(nullptr),
      fallback_database_(nullptr),
      default_error_collector_(nullptr),
      underlay_(underlay),
      tables_(new Tables),
      enforce_dependencies_(true),
      lazily_build_dependencies_(false),
      allow_unknown_(false),
      enforce_weak_(false),
      disallow_enforce_utf8_(false) {}